

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorProto_ExtensionRange::DescriptorProto_ExtensionRange
          (DescriptorProto_ExtensionRange *this)

{
  DescriptorProto_ExtensionRange *pDVar1;
  DescriptorProto_ExtensionRange *this_local;
  
  Message::Message(&this->super_Message);
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__DescriptorProto_ExtensionRange_006fb2b0;
  internal::InternalMetadataWithArena::InternalMetadataWithArena
            (&this->_internal_metadata_,(Arena *)0x0);
  memset(&this->_has_bits_,0,4);
  pDVar1 = internal_default_instance();
  if (this != pDVar1) {
    protobuf_google_2fprotobuf_2fdescriptor_2eproto::InitDefaults();
  }
  SharedCtor(this);
  return;
}

Assistant:

DescriptorProto_ExtensionRange::DescriptorProto_ExtensionRange()
  : ::google::protobuf::Message(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_google_2fprotobuf_2fdescriptor_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:google.protobuf.DescriptorProto.ExtensionRange)
}